

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_isBaseUnitAllStandardUnits_Test::TestBody(Units_isBaseUnitAllStandardUnits_Test *this)

{
  char cVar1;
  byte bVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  long lVar4;
  undefined4 *puVar5;
  ulong **ppuVar6;
  char *pcVar7;
  pointer pSVar8;
  initializer_list<libcellml::Units::StandardUnit> __l;
  initializer_list<unsigned_long> __l_00;
  string pre;
  AssertionResult gtest_ar_;
  string id;
  vector<unsigned_long,_std::allocator<unsigned_long>_> baseUnitIndices;
  size_t index;
  UnitsPtr u;
  vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
  standardUnits;
  UnitsPtr testUnit;
  string ref;
  double uExp;
  double expMult;
  long *local_1a0;
  long *local_198;
  undefined8 local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  byte local_178 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  long *local_148 [2];
  long local_138 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  AssertHelper local_110 [8];
  long local_108;
  ulong local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_> local_f0;
  string local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ulong *local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  ulong local_b8 [15];
  double local_40;
  string local_38 [8];
  
  puVar5 = &DAT_001613b8;
  ppuVar6 = &local_c8;
  for (lVar4 = 0x1f; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)ppuVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    ppuVar6 = (ulong **)((long)ppuVar6 + 4);
  }
  __l._M_len = 0x1f;
  __l._M_array = (iterator)&local_c8;
  std::vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>::
  vector(&local_f0,__l,(allocator_type *)&local_198);
  local_b8[4] = 0x12;
  local_b8[5] = 0x17;
  local_b8[2] = 0xd;
  local_b8[3] = 0x11;
  local_b8[0] = 4;
  local_b8[1] = 0xc;
  local_c8 = (ulong *)0x0;
  sStack_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&local_c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_128,__l_00,(allocator_type *)&local_198);
  local_198 = (long *)&DAT_0000001f;
  local_168 = (undefined1 *)
              ((long)local_f0.
                     super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_f0.
                     super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_c8,"size_t(31)","standardUnits.size()",(unsigned_long *)&local_198,
             (unsigned_long *)&local_168);
  if (local_c8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (sStack_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x89a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_198 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_198 != (long *)0x0)) {
        (**(code **)(*local_198 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_198 = (long *)&DAT_00000008;
  local_168 = (undefined1 *)
              ((long)local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_c8,"size_t(8)","baseUnitIndices.size()",(unsigned_long *)&local_198,
             (unsigned_long *)&local_168);
  if (local_c8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (sStack_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x89b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_198 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_198 != (long *)0x0)) {
        (**(code **)(*local_198 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Units::create();
  local_c8 = local_b8;
  sStack_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8[0] = local_b8[0] & 0xffffffffffffff00;
  local_198 = (long *)&local_188;
  local_190 = 0;
  local_188 = 0;
  local_168 = &local_158;
  local_160 = 0;
  local_158 = 0;
  local_108 = 0;
  if (local_f0.
      super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f0.
      super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar8 = local_f0.
             super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      libcellml::Units::addUnit((StandardUnit)local_100);
      libcellml::Units::unitAttributes
                (local_100,(string *)0x0,(string *)&local_c8,(double *)&local_198,&local_40,local_38
                );
      libcellml::Units::create(local_d8);
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_108);
      if (_Var3._M_current ==
          local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar2 = libcellml::Units::isBaseUnit();
        local_178[0] = bVar2 ^ 1;
        local_170.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2 != 0) {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_148,(char *)local_178,"testUnit->isBaseUnit()","true")
          ;
          testing::internal::AssertHelper::AssertHelper
                    (local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                     ,0x8ae,(char *)local_148[0]);
          testing::internal::AssertHelper::operator=(local_110,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(local_110);
          if (local_148[0] != local_138) {
            operator_delete(local_148[0],local_138[0] + 1);
          }
          if (local_1a0 != (long *)0x0) {
            cVar1 = testing::internal::IsTrue(true);
            if ((cVar1 != '\0') && (local_1a0 != (long *)0x0)) {
              (**(code **)(*local_1a0 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        local_178[0] = libcellml::Units::isBaseUnit();
        local_170.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_178[0] == 0) {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_148,(char *)local_178,"testUnit->isBaseUnit()","false"
                    );
          testing::internal::AssertHelper::AssertHelper
                    (local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                     ,0x8ac,(char *)local_148[0]);
          testing::internal::AssertHelper::operator=(local_110,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(local_110);
          if (local_148[0] != local_138) {
            operator_delete(local_148[0],local_138[0] + 1);
          }
          if (local_1a0 != (long *)0x0) {
            cVar1 = testing::internal::IsTrue(true);
            if ((cVar1 != '\0') && (local_1a0 != (long *)0x0)) {
              (**(code **)(*local_1a0 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      libcellml::Units::removeUnit((StandardUnit)local_100);
      local_108 = local_108 + 1;
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != local_f0.
                       super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (local_168 != &local_158) {
      operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
    }
  }
  if (local_198 != (long *)&local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.
      super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Units, isBaseUnitAllStandardUnits)
{
    const std::vector<libcellml::Units::StandardUnit> standardUnits = {
        libcellml::Units::StandardUnit::AMPERE,
        libcellml::Units::StandardUnit::BECQUEREL,
        libcellml::Units::StandardUnit::CANDELA,
        libcellml::Units::StandardUnit::COULOMB,
        libcellml::Units::StandardUnit::DIMENSIONLESS,
        libcellml::Units::StandardUnit::FARAD,
        libcellml::Units::StandardUnit::GRAM,
        libcellml::Units::StandardUnit::GRAY,
        libcellml::Units::StandardUnit::HENRY,
        libcellml::Units::StandardUnit::HERTZ,
        libcellml::Units::StandardUnit::JOULE,
        libcellml::Units::StandardUnit::KATAL,
        libcellml::Units::StandardUnit::KELVIN,
        libcellml::Units::StandardUnit::KILOGRAM,
        libcellml::Units::StandardUnit::LITRE,
        libcellml::Units::StandardUnit::LUMEN,
        libcellml::Units::StandardUnit::LUX,
        libcellml::Units::StandardUnit::METRE,
        libcellml::Units::StandardUnit::MOLE,
        libcellml::Units::StandardUnit::NEWTON,
        libcellml::Units::StandardUnit::OHM,
        libcellml::Units::StandardUnit::PASCAL,
        libcellml::Units::StandardUnit::RADIAN,
        libcellml::Units::StandardUnit::SECOND,
        libcellml::Units::StandardUnit::SIEMENS,
        libcellml::Units::StandardUnit::SIEVERT,
        libcellml::Units::StandardUnit::STERADIAN,
        libcellml::Units::StandardUnit::TESLA,
        libcellml::Units::StandardUnit::VOLT,
        libcellml::Units::StandardUnit::WATT,
        libcellml::Units::StandardUnit::WEBER,
    };

    const std::vector<size_t> baseUnitIndices = {0, 2, 4, 12, 13, 17, 18, 23};

    EXPECT_EQ(size_t(31), standardUnits.size());
    EXPECT_EQ(size_t(8), baseUnitIndices.size());

    libcellml::UnitsPtr u = libcellml::Units::create();
    std::string ref;
    std::string pre;
    std::string id;
    double expMult;
    double uExp;

    size_t index = 0;
    for (auto standardUnit : standardUnits) {
        u->addUnit(standardUnit);
        u->unitAttributes(0, ref, pre, uExp, expMult, id);

        libcellml::UnitsPtr testUnit = libcellml::Units::create(ref);
        auto found = std::find(baseUnitIndices.begin(), baseUnitIndices.end(), index);
        if (found != baseUnitIndices.end()) {
            EXPECT_TRUE(testUnit->isBaseUnit());
        } else {
            EXPECT_FALSE(testUnit->isBaseUnit());
        }

        u->removeUnit(standardUnit);
        index++;
    }
}